

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O3

void __thiscall
JsUtil::List<Lifetime_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
EnsureArray(List<Lifetime_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            *this,int32 requiredCapacity)

{
  int left;
  BVSparseNode *src;
  Type this_00;
  bool bVar1;
  Lifetime **dst;
  Type ppLVar2;
  size_t sVar3;
  int32 local_2c;
  int32 local_28;
  int32 newBufferSize;
  int32 oldBufferSize;
  int32 newLength;
  
  if ((this->super_ReadOnlyList<Lifetime_*,_Memory::JitArenaAllocator,_DefaultComparer>).buffer ==
      (Type)0x0) {
    if (requiredCapacity < this->increment) {
      requiredCapacity = this->increment;
    }
    if (requiredCapacity == 0) {
      ppLVar2 = (Type)&DAT_00000008;
    }
    else {
      sVar3 = 0xffffffffffffffff;
      if (-1 < requiredCapacity) {
        sVar3 = (ulong)(uint)requiredCapacity << 3;
      }
      ppLVar2 = (Type)new__<Memory::JitArenaAllocator>
                                (sVar3,(this->
                                       super_ReadOnlyList<Lifetime_*,_Memory::JitArenaAllocator,_DefaultComparer>
                                       ).alloc,0x3eba5c);
    }
    (this->super_ReadOnlyList<Lifetime_*,_Memory::JitArenaAllocator,_DefaultComparer>).buffer =
         ppLVar2;
    (this->super_ReadOnlyList<Lifetime_*,_Memory::JitArenaAllocator,_DefaultComparer>).count = 0;
    this->length = requiredCapacity;
    return;
  }
  left = this->length;
  if ((this->super_ReadOnlyList<Lifetime_*,_Memory::JitArenaAllocator,_DefaultComparer>).count ==
      left || left < requiredCapacity) {
    newBufferSize = 0;
    local_2c = 0;
    local_28 = 0;
    bVar1 = Int32Math::Add(left,1,&newBufferSize);
    if ((bVar1) || (bVar1 = Int32Math::Shl(newBufferSize,1,&newBufferSize), bVar1)) {
      ExternalApi::RaiseOnIntOverflow();
    }
    if (requiredCapacity < newBufferSize) {
      requiredCapacity = newBufferSize;
    }
    newBufferSize = requiredCapacity;
    bVar1 = Int32Math::Mul(8,requiredCapacity,&local_2c);
    if ((bVar1) || (bVar1 = Int32Math::Mul(8,this->length,&local_28), bVar1)) {
      ExternalApi::RaiseOnIntOverflow();
    }
    if ((ulong)(uint)newBufferSize == 0) {
      sVar3 = 0;
      dst = (Lifetime **)&DAT_00000008;
    }
    else {
      sVar3 = 0xffffffffffffffff;
      if (-1 < newBufferSize) {
        sVar3 = (ulong)(uint)newBufferSize << 3;
      }
      dst = (Lifetime **)
            new__<Memory::JitArenaAllocator>
                      (sVar3,(this->
                             super_ReadOnlyList<Lifetime_*,_Memory::JitArenaAllocator,_DefaultComparer>
                             ).alloc,0x3eba5c);
      sVar3 = (size_t)newBufferSize;
    }
    src = (BVSparseNode *)
          (this->super_ReadOnlyList<Lifetime_*,_Memory::JitArenaAllocator,_DefaultComparer>).buffer;
    Memory::CopyArray<Lifetime*,Lifetime*,Memory::JitArenaAllocator>
              (dst,sVar3,(Lifetime **)src,(long)this->length);
    this_00 = (this->super_ReadOnlyList<Lifetime_*,_Memory::JitArenaAllocator,_DefaultComparer>).
              alloc;
    if ((long)local_28 == 0x18) {
      src->next = (Type)this_00->bvFreeList;
      this_00->bvFreeList = src;
    }
    else {
      Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)this_00,src,
                 (long)local_28);
    }
    this->length = newBufferSize;
    (this->super_ReadOnlyList<Lifetime_*,_Memory::JitArenaAllocator,_DefaultComparer>).buffer = dst;
    return;
  }
  return;
}

Assistant:

void EnsureArray(DECLSPEC_GUARD_OVERFLOW int32 requiredCapacity)
        {
            if (this->buffer == nullptr)
            {
                int32 newSize = max(requiredCapacity, increment);

                this->buffer = AllocArray(newSize);
                this->count = 0;
                this->length = newSize;
            }
            else if (this->count == length || requiredCapacity > this->length)
            {
                int32 newLength = 0, newBufferSize = 0, oldBufferSize = 0;

                if (Int32Math::Add(length, 1u, &newLength)
                    || Int32Math::Shl(newLength, 1u, &newLength))
                {
                    JsUtil::ExternalApi::RaiseOnIntOverflow();
                }

                newLength = max(requiredCapacity, newLength);

                if (Int32Math::Mul(sizeof(T), newLength, &newBufferSize)
                    || Int32Math::Mul(sizeof(T), length, &oldBufferSize))
                {
                    JsUtil::ExternalApi::RaiseOnIntOverflow();
                }

                Field(T, TAllocator)* newbuffer = AllocArray(newLength);
                Field(T, TAllocator)* oldbuffer = this->buffer;
                CopyArray<Field(T, TAllocator), Field(T, TAllocator), EffectiveAllocatorType>(
                    newbuffer, newLength, oldbuffer, length);

                FreeArray(oldbuffer, oldBufferSize);

                this->length = newLength;
                this->buffer = newbuffer;
            }
        }